

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DecimalFormat::toPattern(DecimalFormat *this,UnicodeString *result)

{
  UErrorCode *status;
  DecimalFormatProperties *pDVar1;
  bool bVar2;
  ErrorCode localStatus;
  DecimalFormatProperties tprops;
  ErrorCode local_360;
  UnicodeString local_350;
  DecimalFormatProperties local_310;
  
  local_360._vptr_ErrorCode = (_func_int **)&PTR__ErrorCode_003b4910;
  local_360.errorCode = U_ZERO_ERROR;
  icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties
            (&local_310,
             (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr);
  status = &local_360.errorCode;
  if (((local_310.currency.fNull == true) &&
      (local_310.currencyPluralInfo.fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr ==
       (LocalPointerBase<icu_63::CurrencyPluralInfo>)0x0)) &&
     (local_310.currencyUsage.fNull == true)) {
    bVar2 = icu_63::number::impl::AffixUtils::hasCurrencySymbols
                      (&local_310.positivePrefixPattern,status);
    if (!bVar2) {
      bVar2 = icu_63::number::impl::AffixUtils::hasCurrencySymbols
                        (&local_310.positiveSuffixPattern,status);
      if (!bVar2) {
        bVar2 = icu_63::number::impl::AffixUtils::hasCurrencySymbols
                          (&local_310.negativePrefixPattern,status);
        if (!bVar2) {
          bVar2 = icu_63::number::impl::AffixUtils::hasCurrencySymbols
                            (&local_310.negativeSuffixPattern,status);
          if (!bVar2) goto LAB_0024d1a8;
        }
      }
    }
  }
  pDVar1 = (this->fields->exportedProperties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  local_310.minimumFractionDigits = pDVar1->minimumFractionDigits;
  local_310.maximumFractionDigits = pDVar1->maximumFractionDigits;
  local_310.roundingIncrement = pDVar1->roundingIncrement;
LAB_0024d1a8:
  icu_63::number::impl::PatternStringUtils::propertiesToPatternString(&local_350,&local_310,status);
  UnicodeString::moveFrom(result,&local_350);
  UnicodeString::~UnicodeString(&local_350);
  icu_63::number::impl::DecimalFormatProperties::~DecimalFormatProperties(&local_310);
  ErrorCode::~ErrorCode(&local_360);
  return result;
}

Assistant:

UnicodeString& DecimalFormat::toPattern(UnicodeString& result) const {
    // Pull some properties from exportedProperties and others from properties
    // to keep affix patterns intact.  In particular, pull rounding properties
    // so that CurrencyUsage is reflected properly.
    // TODO: Consider putting this logic in number_patternstring.cpp instead.
    ErrorCode localStatus;
    DecimalFormatProperties tprops(*fields->properties);
    bool useCurrency = ((!tprops.currency.isNull()) || !tprops.currencyPluralInfo.fPtr.isNull() ||
                        !tprops.currencyUsage.isNull() || AffixUtils::hasCurrencySymbols(
            tprops.positivePrefixPattern, localStatus) || AffixUtils::hasCurrencySymbols(
            tprops.positiveSuffixPattern, localStatus) || AffixUtils::hasCurrencySymbols(
            tprops.negativePrefixPattern, localStatus) || AffixUtils::hasCurrencySymbols(
            tprops.negativeSuffixPattern, localStatus));
    if (useCurrency) {
        tprops.minimumFractionDigits = fields->exportedProperties->minimumFractionDigits;
        tprops.maximumFractionDigits = fields->exportedProperties->maximumFractionDigits;
        tprops.roundingIncrement = fields->exportedProperties->roundingIncrement;
    }
    result = PatternStringUtils::propertiesToPatternString(tprops, localStatus);
    return result;
}